

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiTextFilter::Build(ImGuiTextFilter *this)

{
  int *piVar1;
  uint uVar2;
  char *pcVar3;
  TextRange *__dest;
  ImGuiContext *pIVar4;
  size_t sVar5;
  ulong uVar6;
  TextRange *pTVar7;
  long lVar8;
  ulong uVar9;
  TextRange input_range;
  TextRange local_30;
  
  pIVar4 = GImGui;
  if (-1 < (this->Filters).Capacity) goto LAB_0012ef53;
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  __dest = (TextRange *)(*(pIVar4->IO).MemAllocFn)(0);
  pTVar7 = (this->Filters).Data;
  if (pTVar7 == (TextRange *)0x0) {
LAB_0012ef3a:
    pTVar7 = (TextRange *)0x0;
    pIVar4 = GImGui;
  }
  else {
    memcpy(__dest,pTVar7,(long)(this->Filters).Size << 4);
    pIVar4 = GImGui;
    pTVar7 = (this->Filters).Data;
    if (pTVar7 == (TextRange *)0x0) goto LAB_0012ef3a;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(pIVar4->IO).MemFreeFn)(pTVar7);
  (this->Filters).Data = __dest;
  (this->Filters).Capacity = 0;
LAB_0012ef53:
  (this->Filters).Size = 0;
  sVar5 = strlen(this->InputBuf);
  local_30.e = this->InputBuf + sVar5;
  local_30.b = this->InputBuf;
  TextRange::split(&local_30,',',&this->Filters);
  this->CountGrep = 0;
  uVar2 = (this->Filters).Size;
  uVar6 = (ulong)uVar2;
  if (uVar2 != 0) {
    lVar8 = 0;
    uVar9 = 0;
    do {
      if ((long)(int)uVar6 <= (long)uVar9) {
LAB_0012efed:
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                      ,0x353,
                      "value_type &ImVector<ImGuiTextFilter::TextRange>::operator[](int) [T = ImGuiTextFilter::TextRange]"
                     );
      }
      TextRange::trim_blanks((TextRange *)((long)&((this->Filters).Data)->b + lVar8));
      uVar2 = (this->Filters).Size;
      uVar6 = (ulong)(int)uVar2;
      if ((long)uVar6 <= (long)uVar9) goto LAB_0012efed;
      pTVar7 = (this->Filters).Data;
      pcVar3 = *(char **)((long)&pTVar7->b + lVar8);
      if ((pcVar3 != *(char **)((long)&pTVar7->e + lVar8)) && (*pcVar3 != '-')) {
        this->CountGrep = this->CountGrep + 1;
      }
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x10;
    } while (uVar9 != uVar2);
  }
  return;
}

Assistant:

void ImGuiTextFilter::Build()
{
    Filters.resize(0);
    TextRange input_range(InputBuf, InputBuf+strlen(InputBuf));
    input_range.split(',', Filters);

    CountGrep = 0;
    for (int i = 0; i != Filters.Size; i++)
    {
        Filters[i].trim_blanks();
        if (Filters[i].empty())
            continue;
        if (Filters[i].front() != '-')
            CountGrep += 1;
    }
}